

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void label_cb(Fl_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__src;
  Fl_Type *local_28;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Input *i_local;
  
  if ((char *)v == "LOAD") {
    pcVar3 = Fl_Type::label(&current_widget->super_Fl_Type);
    Fl_Input_::static_value(&i->super_Fl_Input_,pcVar3);
    pcVar3 = Fl_Input_::value(&i->super_Fl_Input_);
    sVar4 = strlen(pcVar3);
    if (oldlabellen <= sVar4) {
      pcVar3 = Fl_Input_::value(&i->super_Fl_Input_);
      sVar4 = strlen(pcVar3);
      oldlabellen = (int)sVar4 + 0x80;
      oldlabel = (char *)realloc(oldlabel,(ulong)oldlabellen);
    }
    pcVar3 = oldlabel;
    __src = Fl_Input_::value(&i->super_Fl_Input_);
    strcpy(pcVar3,__src);
  }
  else {
    bVar1 = false;
    for (local_28 = Fl_Type::first; local_28 != (Fl_Type *)0x0; local_28 = local_28->next) {
      if ((local_28->selected != '\0') && (iVar2 = (*local_28->_vptr_Fl_Type[0x17])(), iVar2 != 0))
      {
        pcVar3 = Fl_Input_::value(&i->super_Fl_Input_);
        Fl_Type::label(local_28,pcVar3);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void label_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    i->static_value(current_widget->label());
    if (strlen(i->value()) >= oldlabellen) {
      oldlabellen = strlen(i->value())+128;
      oldlabel = (char*)realloc(oldlabel,oldlabellen);
    }
    strcpy(oldlabel,i->value());
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        o->label(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}